

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priminfo.h
# Opt level: O2

CentGeom<embree::LBBox<embree::Vec3fa>_> * __thiscall
embree::CentGeom<embree::LBBox<embree::Vec3fa>_>::operator=
          (CentGeom<embree::LBBox<embree::Vec3fa>_> *this,
          CentGeom<embree::LBBox<embree::Vec3fa>_> *param_1)

{
  undefined8 uVar1;
  
  uVar1 = *(undefined8 *)((long)&(param_1->geomBounds).bounds0.lower.field_0 + 8);
  *(undefined8 *)&(this->geomBounds).bounds0.lower.field_0 =
       *(undefined8 *)&(param_1->geomBounds).bounds0.lower.field_0;
  *(undefined8 *)((long)&(this->geomBounds).bounds0.lower.field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&(param_1->geomBounds).bounds0.upper.field_0 + 8);
  *(undefined8 *)&(this->geomBounds).bounds0.upper.field_0 =
       *(undefined8 *)&(param_1->geomBounds).bounds0.upper.field_0;
  *(undefined8 *)((long)&(this->geomBounds).bounds0.upper.field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&(param_1->geomBounds).bounds1.lower.field_0 + 8);
  *(undefined8 *)&(this->geomBounds).bounds1.lower.field_0 =
       *(undefined8 *)&(param_1->geomBounds).bounds1.lower.field_0;
  *(undefined8 *)((long)&(this->geomBounds).bounds1.lower.field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&(param_1->geomBounds).bounds1.upper.field_0 + 8);
  *(undefined8 *)&(this->geomBounds).bounds1.upper.field_0 =
       *(undefined8 *)&(param_1->geomBounds).bounds1.upper.field_0;
  *(undefined8 *)((long)&(this->geomBounds).bounds1.upper.field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&(param_1->centBounds).lower.field_0 + 8);
  *(undefined8 *)&(this->centBounds).lower.field_0 =
       *(undefined8 *)&(param_1->centBounds).lower.field_0;
  *(undefined8 *)((long)&(this->centBounds).lower.field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&(param_1->centBounds).upper.field_0 + 8);
  *(undefined8 *)&(this->centBounds).upper.field_0 =
       *(undefined8 *)&(param_1->centBounds).upper.field_0;
  *(undefined8 *)((long)&(this->centBounds).upper.field_0 + 8) = uVar1;
  return this;
}

Assistant:

__forceinline CentGeom () {}